

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O1

void __thiscall tinyxml2::XMLDocument::~XMLDocument(XMLDocument *this)

{
  XMLNode **ppXVar1;
  char *pcVar2;
  
  (this->super_XMLNode)._vptr_XMLNode = (_func_int **)&PTR_ToElement_0027f940;
  Clear(this);
  MemPoolT<104>::~MemPoolT(&this->_commentPool);
  MemPoolT<112>::~MemPoolT(&this->_textPool);
  MemPoolT<80>::~MemPoolT(&this->_attributePool);
  MemPoolT<120>::~MemPoolT(&this->_elementPool);
  ppXVar1 = (this->_unlinked)._mem;
  if (ppXVar1 != (XMLNode **)0x0 && ppXVar1 != (this->_unlinked)._pool) {
    operator_delete__(ppXVar1);
  }
  if ((((this->_errorStr)._flags & 0x200) != 0) &&
     (pcVar2 = (this->_errorStr)._start, pcVar2 != (char *)0x0)) {
    operator_delete__(pcVar2);
  }
  (this->_errorStr)._flags = 0;
  (this->_errorStr)._start = (char *)0x0;
  (this->_errorStr)._end = (char *)0x0;
  XMLComment::~XMLComment((XMLComment *)this);
  return;
}

Assistant:

XMLDocument::~XMLDocument()
{
    Clear();
}